

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O1

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::Consume::begin_iteration
          (Consume *this,
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          *i_queue)

{
  long *plVar1;
  __pointer_type pLVar2;
  __pointer_type pLVar3;
  ulong uVar4;
  uintptr_t uint_pointer;
  __pointer_type pLVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  pLVar5 = (i_queue->m_head)._M_b._M_p;
  if (pLVar5 == (__pointer_type)0x0) {
    pLVar5 = (i_queue->m_head)._M_b._M_p;
    if (pLVar5 == (__pointer_type)0x0) {
      pLVar2 = (i_queue->
               super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
               ).m_initial_page._M_b._M_p;
      LOCK();
      pLVar3 = (i_queue->m_head)._M_b._M_p;
      bVar6 = pLVar3 == (__pointer_type)0x0;
      if (bVar6) {
        (i_queue->m_head)._M_b._M_p = pLVar2;
        pLVar3 = pLVar5;
      }
      UNLOCK();
      pLVar5 = pLVar3;
      if (bVar6) {
        pLVar5 = pLVar2;
      }
    }
    if (pLVar5 == (__pointer_type)0x0) {
      this->m_next_ptr = 0;
      return true;
    }
  }
  uVar4 = (ulong)this->m_control ^ (ulong)pLVar5;
  while (0xffff < uVar4) {
    PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init();
    if (*(long *)(in_FS_OFFSET + -0x88) != 0) {
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::process_pending_unpins_impl
                (progress_lock_free);
    }
    LOCK();
    plVar1 = (long *)(((ulong)pLVar5 & 0xffffffffffff0000) + 0xfff8);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    if (this->m_control != (ControlBlock *)0x0) {
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page(this->m_control);
    }
    this->m_control = pLVar5;
    pLVar5 = (i_queue->m_head)._M_b._M_p;
    uVar4 = (ulong)this->m_control ^ (ulong)pLVar5;
  }
  this->m_queue = i_queue;
  this->m_control = pLVar5;
  this->m_next_ptr = pLVar5->m_next;
  bVar6 = empty(this);
  if ((!bVar6) && (this->m_next_ptr < 0x10000)) {
    density_tests::detail::assert_failed<>
              ("empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xb4);
  }
  return true;
}

Assistant:

bool begin_iteration(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSUME_ALIGNED(m_control, Base::s_alloc_granularity);

                    ControlBlock * head = i_queue->m_head.load();
                    DENSITY_ASSUME_ALIGNED(head, Base::s_alloc_granularity);

                    if (head == nullptr)
                    {
                        head = init_head(i_queue);
                        if (head == nullptr)
                        {
                            m_next_ptr = 0;
                            return true;
                        }
                    }

                    while (!Base::same_page(m_control, head))
                    {
                        DENSITY_ASSUME(m_control != head);

                        i_queue->ALLOCATOR_TYPE::pin_page(head);

                        if (m_control != nullptr)
                        {
                            i_queue->ALLOCATOR_TYPE::unpin_page(m_control);
                        }

                        m_control = head;

                        head = i_queue->m_head.load();
                        DENSITY_ASSUME_ALIGNED(head, Base::s_alloc_granularity);
                    }

                    m_queue    = i_queue;
                    m_control  = static_cast<ControlBlock *>(head);
                    m_next_ptr = raw_atomic_load(&m_control->m_next, mem_relaxed);
                    DENSITY_ASSERT_INTERNAL(
                      empty() || m_next_ptr >= ALLOCATOR_TYPE::page_alignment);
                    return true;
                }